

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> ** __thiscall
DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*,RealCount>::
PrependNode<Memory::ArenaAllocator,Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*>
          (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*,RealCount>
           *this,ArenaAllocator *allocator,
          ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *param1)

{
  long lVar1;
  long *plVar2;
  
  plVar2 = (long *)new<Memory::ArenaAllocator>(0x18,allocator,0x35916e);
  plVar2[2] = (long)param1;
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }